

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_DigestKey(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject)

{
  Token *this_00;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  CK_STATE sessionState;
  HashAlgorithm *pHVar4;
  size_t *in_RCX;
  long in_RDI;
  uchar *in_R8;
  size_t in_R9;
  ByteString keybits;
  Type algo;
  CK_RV rv;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  OSObject *key;
  Token *token;
  Session *session;
  Session *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined1 local_d8 [24];
  CK_OBJECT_HANDLE in_stack_ffffffffffffff40;
  HandleManager *in_stack_ffffffffffffff48;
  EVP_PKEY_CTX local_a0 [40];
  uchar local_78 [44];
  Type local_4c;
  CK_RV local_48;
  byte local_3a;
  byte local_39;
  long *local_38;
  Token *local_30;
  Session *local_28;
  CK_RV local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    return 400;
  }
  local_28 = (Session *)
             HandleManager::getSession(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if (local_28 == (Session *)0x0) {
    return 0xb3;
  }
  iVar1 = Session::getOpType(local_28);
  if (iVar1 != 4) {
    return 0x91;
  }
  local_30 = Session::getToken(local_28);
  if (local_30 == (Token *)0x0) {
    return 5;
  }
  local_38 = (long *)HandleManager::getObject(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if ((local_38 == (long *)0x0) || (uVar3 = (**(code **)(*local_38 + 0x50))(), (uVar3 & 1) == 0)) {
    return 0x60;
  }
  local_39 = (**(code **)(*local_38 + 0x20))(local_38,1,0);
  local_39 = local_39 & 1;
  local_3a = (**(code **)(*local_38 + 0x20))(local_38,2,1);
  local_3a = local_3a & 1;
  sessionState = Session::getState(in_stack_fffffffffffffef8);
  local_48 = haveRead(sessionState,local_39,local_3a);
  if (local_48 != 0) {
    if (local_48 == 0x101) {
      softHSMLog(6,"C_DigestKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0xee2,"User is not authorized");
    }
    return 5;
  }
  local_4c = Session::getHashAlgo(local_28);
  if ((((local_4c != SHA1) && (local_4c != SHA224)) && (local_4c != SHA256)) &&
     ((local_4c != SHA384 && (local_4c != SHA512)))) {
    uVar3 = (**(code **)(*local_38 + 0x20))(local_38,0x162,0);
    if ((uVar3 & 1) == 0) {
      return 0x67;
    }
    uVar3 = (**(code **)(*local_38 + 0x20))(local_38,0x103,0);
    if ((uVar3 & 1) != 0) {
      return 0x67;
    }
  }
  uVar3 = (**(code **)(*local_38 + 0x10))(local_38,0x11);
  if ((uVar3 & 1) == 0) {
    return 0x67;
  }
  ByteString::ByteString((ByteString *)0x16d342);
  this_00 = local_30;
  if (local_3a == 0) {
    (**(code **)(*local_38 + 0x30))(local_d8,local_38,0x11);
    ByteString::operator=
              ((ByteString *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (ByteString *)in_stack_fffffffffffffef8);
    ByteString::~ByteString((ByteString *)0x16d43b);
  }
  else {
    (**(code **)(*local_38 + 0x30))(local_a0,local_38,0x11);
    iVar1 = Token::decrypt(this_00,local_a0,local_78,in_RCX,in_R8,in_R9);
    ByteString::~ByteString((ByteString *)0x16d3ab);
    if ((((byte)iVar1 ^ 0xff) & 1) != 0) {
      local_8 = 5;
      goto LAB_0016d4d1;
    }
  }
  pHVar4 = Session::getDigestOp(local_28);
  uVar2 = (*pHVar4->_vptr_HashAlgorithm[3])(pHVar4,local_78);
  if ((uVar2 & 1) == 0) {
    Session::resetOp((Session *)CONCAT17((char)uVar2,in_stack_ffffffffffffff00));
    local_8 = 5;
  }
  else {
    local_8 = 0;
  }
LAB_0016d4d1:
  ByteString::~ByteString((ByteString *)0x16d4de);
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_DigestKey(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DIGEST) return CKR_OPERATION_NOT_INITIALIZED;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hObject);
	if (key == NULL_PTR || !key->isValid()) return CKR_KEY_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		// CKR_USER_NOT_LOGGED_IN is not a valid return code for this function,
		// so we use CKR_GENERAL_ERROR.
		return CKR_GENERAL_ERROR;
	}

	// Whitelist
	HashAlgo::Type algo = session->getHashAlgo();
	if (algo != HashAlgo::SHA1 &&
	    algo != HashAlgo::SHA224 &&
	    algo != HashAlgo::SHA256 &&
	    algo != HashAlgo::SHA384 &&
	    algo != HashAlgo::SHA512)
	{
		// Parano...
		if (!key->getBooleanValue(CKA_EXTRACTABLE, false))
			return CKR_KEY_INDIGESTIBLE;
		if (key->getBooleanValue(CKA_SENSITIVE, false))
			return CKR_KEY_INDIGESTIBLE;
	}

	// Get value
	if (!key->attributeExists(CKA_VALUE))
		return CKR_KEY_INDIGESTIBLE;
	ByteString keybits;
	if (isPrivate)
	{
		if (!token->decrypt(key->getByteStringValue(CKA_VALUE), keybits))
			return CKR_GENERAL_ERROR;
	}
	else
	{
		keybits = key->getByteStringValue(CKA_VALUE);
	}

	// Digest the value
	if (session->getDigestOp()->hashUpdate(keybits) == false)
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	return CKR_OK;
}